

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stream.cpp
# Opt level: O2

void __thiscall lambda_sum_Test::TestBody(lambda_sum_Test *this)

{
  Curried<std::plus<void>_> *ts_5;
  char *message;
  Fold<int,_const_lambda::Curried<std::plus<void>_>_&> pipeable;
  int *in_stack_ffffffffffffff78;
  AssertHelper local_80;
  AssertionResult gtest_ar;
  undefined4 local_68;
  int local_64 [5];
  undefined4 local_50;
  int local_4c;
  Range<std::vector<int,_std::allocator<int>_>_> local_48;
  _Vector_base<int,_std::allocator<int>_> local_20;
  
  local_80.data_._0_4_ = 0x1f;
  local_50 = 1;
  local_64[4] = 2;
  local_64[3] = 3;
  local_64[2] = 4;
  local_64[1] = 6;
  local_64[0] = 7;
  ts_5 = (Curried<std::plus<void>_> *)&local_68;
  local_68 = 8;
  lambda::factory::vector<int,int,int,int,int,int,int>
            ((vector<int,_std::allocator<int>_> *)&local_20,(factory *)&local_50,local_64 + 4,
             local_64 + 3,local_64 + 2,local_64 + 1,local_64,(int *)ts_5,in_stack_ffffffffffffff78);
  lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>::Range
            (&local_48,(vector<int,_std::allocator<int>_> *)&local_20);
  pipeable.f = ts_5;
  pipeable._0_8_ = DAT_001796f8;
  local_4c = lambda::streams::Pipeable::
             pipeable<lambda::streams::Range<std::vector<int,std::allocator<int>>>,lambda::streams::Fold<int,lambda::Curried<std::plus<void>>const&>>
                       ((Pipeable *)&local_48,
                        (Range<std::vector<int,_std::allocator<int>_>_> *)
                        (ulong)lambda::streams::sum,pipeable);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"31","stream(vector(1, 2, 3, 4, 6, 7, 8)) | sum",(int *)&local_80
             ,&local_4c);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_20);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_stream.cpp"
               ,0x17,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(lambda, sum) { ASSERT_EQ(31, stream(vector(1, 2, 3, 4, 6, 7, 8)) | sum); }